

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_image_t * j2k_decode(opj_j2k_t *j2k,opj_cio_t *cio,opj_codestream_info_t *cstr_info)

{
  uint uVar1;
  opj_common_ptr cinfo;
  opj_dec_mstabent_t *poVar2;
  uint uVar3;
  int iVar4;
  opj_dec_mstabent_t *e;
  opj_image_t *image;
  opj_dec_mstabent_t *poVar5;
  char *fmt;
  int iVar6;
  opj_image_t *unaff_R14;
  
  cinfo = j2k->cinfo;
  j2k->cio = cio;
  j2k->cstr_info = cstr_info;
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    cstr_info->main_head_end = 0;
    cstr_info->codestream_size = 0;
    cstr_info->tile = (opj_tile_info_t *)0x0;
    cstr_info->marker = (opj_marker_info_t *)0x0;
    cstr_info->maxmarknum = 0;
    cstr_info->main_head_start = 0;
    cstr_info->numdecompos = (int *)0x0;
    *(undefined8 *)&cstr_info->marknum = 0;
    cstr_info->th = 0;
    cstr_info->numcomps = 0;
    *(undefined8 *)&cstr_info->numlayers = 0;
    cstr_info->tile_y = 0;
    cstr_info->tile_Ox = 0;
    cstr_info->tile_Oy = 0;
    cstr_info->tw = 0;
    cstr_info->image_w = 0;
    cstr_info->image_h = 0;
    cstr_info->prog = LRCP;
    cstr_info->tile_x = 0;
    cstr_info->D_max = 0.0;
    cstr_info->packno = 0;
    cstr_info->index_write = 0;
  }
  image = opj_image_create0();
  j2k->image = image;
  j2k->state = 1;
  do {
    uVar3 = cio_read(cio,2);
    if ((uVar3 & 0xffffff00) == 0xff00) {
      poVar2 = j2k_dec_mstab;
      do {
        poVar5 = poVar2;
        uVar1 = poVar5->id;
        if (uVar1 == 0) break;
        poVar2 = poVar5 + 1;
      } while (uVar1 != uVar3);
      if ((j2k->state & poVar5->states) == 0) {
        opj_image_destroy(image);
        iVar4 = cio_tell(cio);
        fmt = "%.8x: unexpected marker %x\n";
        goto LAB_001f143f;
      }
      if ((uVar1 != 0xff90) || (j2k->cp->limit_decoding != LIMIT_TO_MAIN_HEADER)) {
        if (poVar5->handler != (_func_void_opj_j2k_t_ptr *)0x0) {
          (*poVar5->handler)(j2k);
        }
        iVar4 = j2k->state;
        if (-1 < (short)iVar4) {
          iVar6 = 2;
          if ((iVar4 != 0x20) && (iVar4 != 0x40)) {
            iVar6 = 0;
          }
          goto LAB_001f144c;
        }
        goto LAB_001f1449;
      }
      opj_event_msg(cinfo,4,"Main Header decoded.\n");
      iVar6 = 1;
      unaff_R14 = image;
    }
    else {
      opj_image_destroy(image);
      iVar4 = cio_tell(cio);
      fmt = "%.8x: expected a marker instead of %x\n";
LAB_001f143f:
      opj_event_msg(cinfo,1,fmt,(ulong)(iVar4 - 2),(ulong)uVar3);
LAB_001f1449:
      iVar6 = 1;
      unaff_R14 = (opj_image_t *)0x0;
    }
LAB_001f144c:
    if (iVar6 != 0) {
      if (iVar6 == 2) {
        if (j2k->state == 0x40) {
          j2k_read_eoc(j2k);
        }
        unaff_R14 = image;
        if (j2k->state != 0x20) {
          opj_event_msg(cinfo,2,"Incomplete bitstream\n");
        }
      }
      return unaff_R14;
    }
  } while( true );
}

Assistant:

opj_image_t* j2k_decode(opj_j2k_t *j2k, opj_cio_t *cio, opj_codestream_info_t *cstr_info) {
	opj_image_t *image = NULL;

	opj_common_ptr cinfo = j2k->cinfo;	

	j2k->cio = cio;
	j2k->cstr_info = cstr_info;
	if (cstr_info)
		memset(cstr_info, 0, sizeof(opj_codestream_info_t));

	/* create an empty image */
	image = opj_image_create0();
	j2k->image = image;

	j2k->state = J2K_STATE_MHSOC;

	for (;;) {
		opj_dec_mstabent_t *e;
		int id = cio_read(cio, 2);

#ifdef USE_JPWL
		/* we try to honor JPWL correction power */
		if (j2k->cp->correct) {

			int orig_pos = cio_tell(cio);
			opj_bool status;

			/* call the corrector */
			status = jpwl_correct(j2k);

			/* go back to where you were */
			cio_seek(cio, orig_pos - 2);

			/* re-read the marker */
			id = cio_read(cio, 2);

			/* check whether it begins with ff */
			if (id >> 8 != 0xff) {
				opj_event_msg(cinfo, EVT_ERROR,
					"JPWL: possible bad marker %x at %d\n",
					id, cio_tell(cio) - 2);
				if (!JPWL_ASSUME) {
					opj_image_destroy(image);
					opj_event_msg(cinfo, EVT_ERROR, "JPWL: giving up\n");
					return 0;
				}
				/* we try to correct */
				id = id | 0xff00;
				cio_seek(cio, cio_tell(cio) - 2);
				cio_write(cio, id, 2);
				opj_event_msg(cinfo, EVT_WARNING, "- trying to adjust this\n"
					"- setting marker to %x\n",
					id);
			}

		}
#endif /* USE_JPWL */

		if (id >> 8 != 0xff) {
			opj_image_destroy(image);
			opj_event_msg(cinfo, EVT_ERROR, "%.8x: expected a marker instead of %x\n", cio_tell(cio) - 2, id);
			return 0;
		}
		e = j2k_dec_mstab_lookup(id);
		/* Check if the marker is known*/
		if (!(j2k->state & e->states)) {
			opj_image_destroy(image);
			opj_event_msg(cinfo, EVT_ERROR, "%.8x: unexpected marker %x\n", cio_tell(cio) - 2, id);
			return 0;
		}
		/* Check if the decoding is limited to the main header*/
		if (e->id == J2K_MS_SOT && j2k->cp->limit_decoding == LIMIT_TO_MAIN_HEADER) {
			opj_event_msg(cinfo, EVT_INFO, "Main Header decoded.\n");
			return image;
		}		

		if (e->handler) {
			(*e->handler)(j2k);
		}
		if (j2k->state & J2K_STATE_ERR) 
			return NULL;	

		if (j2k->state == J2K_STATE_MT) {
			break;
		}
		if (j2k->state == J2K_STATE_NEOC) {
			break;
		}
	}
	if (j2k->state == J2K_STATE_NEOC) {
		j2k_read_eoc(j2k);
	}

	if (j2k->state != J2K_STATE_MT) {
		opj_event_msg(cinfo, EVT_WARNING, "Incomplete bitstream\n");
	}
	return image;
}